

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printMemBOption(MCInst *MI,uint OpNum,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  uint64_t uVar2;
  char *s;
  uint val;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar1 = MCOperand_getImm(op);
  uVar2 = ARM_getFeatureBits(MI->csh->mode);
  s = ARM_MB_MemBOptToString((int)iVar1 + 1,(uVar2 & 0x80000000000) != 0);
  SStream_concat0(O,s);
  if (MI->csh->detail != CS_OPT_OFF) {
    (MI->flat_insn->detail->field_6).x86.sse_cc = (int)iVar1 + X86_SSE_CC_EQ;
  }
  return;
}

Assistant:

static void printMemBOption(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned val = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	SStream_concat0(O, ARM_MB_MemBOptToString(val + 1,
				(ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops) != 0));

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.mem_barrier = (arm_mem_barrier)(val + 1);
	}
}